

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O0

iterator __thiscall
first_fit_heap<16UL>::free_list_container::insert_after
          (free_list_container *this,header_free *val,iterator other)

{
  bool bVar1;
  header_free *phVar2;
  exception *peVar3;
  header_free *phVar4;
  header_used *this_00;
  header_used *this_01;
  header_used *preceding;
  header_used *following;
  header_free *tmp;
  header_free *local_28;
  header_free *val_local;
  free_list_container *this_local;
  iterator other_local;
  
  local_28 = val;
  val_local = (header_free *)this;
  this_local = (free_list_container *)other.block;
  if (val == (header_free *)0x0) {
    iterator::iterator(&other_local,(header_free *)0x0);
  }
  else {
    phVar2 = iterator::operator*((iterator *)&this_local);
    if (val <= phVar2) {
      peVar3 = (exception *)__cxa_allocate_exception(8);
      std::exception::exception(peVar3);
      __cxa_throw(peVar3,&std::exception::typeinfo,std::exception::~exception);
    }
    tmp = (header_free *)end(this);
    bVar1 = iterator::operator==((iterator *)&this_local,(iterator *)&tmp);
    if (bVar1) {
      header_free::next(local_28,this->list);
      header_used::is_free(&local_28->super_header_used,true);
      header_free::update_footer(local_28);
      this->list = local_28;
    }
    else {
      phVar2 = iterator::operator*((iterator *)&this_local);
      phVar2 = header_free::next(phVar2);
      header_free::next(local_28,phVar2);
      header_used::is_free(&local_28->super_header_used,true);
      header_free::update_footer(local_28);
      phVar2 = local_28;
      phVar4 = iterator::operator*((iterator *)&this_local);
      if (phVar2 == phVar4) {
        peVar3 = (exception *)__cxa_allocate_exception(8);
        std::exception::exception(peVar3);
        __cxa_throw(peVar3,&std::exception::typeinfo,std::exception::~exception);
      }
      phVar2 = iterator::operator*((iterator *)&this_local);
      header_free::next(phVar2,local_28);
    }
    this_00 = header_used::following_block(&local_28->super_header_used,this->mem);
    this_01 = header_used::preceding_block(&local_28->super_header_used,this->mem);
    if (this_00 != (header_used *)0x0) {
      header_used::prev_free(this_00,true);
    }
    if ((this_01 != (header_used *)0x0) && (bVar1 = header_used::is_free(this_01), bVar1)) {
      header_used::prev_free(&local_28->super_header_used,true);
    }
    iterator::iterator(&other_local,local_28);
  }
  return (iterator)other_local.block;
}

Assistant:

iterator insert_after(header_free *val, iterator other)
        {
            if (not val) {
                return {};
            }

            ASSERT_HEAP(val > *other);

            if (other == end()) {
                // insert at list head
                val->next(list);
                val->is_free(true);
                val->update_footer();
                list = val;
            } else {
                // insert block into chain
                auto *tmp = (*other)->next();
                val->next(tmp);
                val->is_free(true);
                val->update_footer();

                ASSERT_HEAP(val != *other);
                (*other)->next(val);
            }

            // update meta data of surrounding blocks
            auto       *following = val->following_block(mem);
            const auto *preceding = val->preceding_block(mem);

            if (following) {
                following->prev_free(true);
            }

            if (preceding and preceding->is_free()) {
                val->prev_free(true);
            }

            return {val};
        }